

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

ON_Brep * ON_BrepCone(ON_Cone *cone,bool bCapBase,ON_Brep *pBrep)

{
  ON_Brep *pOVar1;
  ulong uVar2;
  ON_RevSurface *pRevSurface;
  ON_RevSurface *local_28;
  
  if (pBrep != (ON_Brep *)0x0) {
    ON_Brep::Destroy(pBrep);
  }
  pOVar1 = (ON_Brep *)0x0;
  local_28 = ON_Cone::RevSurfaceForm(cone,(ON_RevSurface *)0x0);
  if (local_28 != (ON_RevSurface *)0x0) {
    uVar2 = -(ulong)(1.490116119385e-08 < ABS(cone->radius));
    (*(local_28->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (0,~uVar2 & 0x401921fb54442d18 |
                 (ulong)(ABS(cone->radius) * 6.283185307179586) & uVar2,local_28,0);
    pOVar1 = ON_BrepRevSurface(&local_28,bCapBase,bCapBase,pBrep);
    if (pOVar1 == (ON_Brep *)0x0) {
      if (local_28 != (ON_RevSurface *)0x0) {
        (*(local_28->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      pOVar1 = (ON_Brep *)0x0;
    }
  }
  return pOVar1;
}

Assistant:

ON_Brep* ON_BrepCone( const ON_Cone& cone, bool bCapBase, ON_Brep* pBrep )
{
  bool bArcLengthParameterization = true;
  ON_Brep* brep = nullptr;
  if ( pBrep )
    pBrep->Destroy();
  ON_RevSurface* pRevSurface = cone.RevSurfaceForm();
  if ( pRevSurface )
  {
    if ( bArcLengthParameterization )
    {
      double r = fabs(cone.radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      pRevSurface->SetDomain(0,0.0,2.0*ON_PI*r);
    }
    brep = ON_BrepRevSurface( pRevSurface, bCapBase, bCapBase, pBrep );
    if ( !brep )
      delete pRevSurface;
  }
  return brep;
}